

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v9::detail::bigint::subtract_bigits(bigint *this,int index,bigit other,bigit *borrow)

{
  bigit *pbVar1;
  long lVar2;
  double_bigit result;
  bigit *borrow_local;
  bigit other_local;
  int index_local;
  bigint *this_local;
  
  pbVar1 = operator[](this,index);
  lVar2 = ((ulong)*pbVar1 - (ulong)other) - (ulong)*borrow;
  pbVar1 = operator[](this,index);
  *pbVar1 = (bigit)lVar2;
  *borrow = (uint)((ulong)lVar2 >> 0x3f);
  return;
}

Assistant:

FMT_CONSTEXPR20 void subtract_bigits(int index, bigit other, bigit& borrow) {
    auto result = static_cast<double_bigit>((*this)[index]) - other - borrow;
    (*this)[index] = static_cast<bigit>(result);
    borrow = static_cast<bigit>(result >> (bigit_bits * 2 - 1));
  }